

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_ssse3.c
# Opt level: O3

uint aom_masked_sad4xh_ssse3
               (uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,int a_stride,uint8_t *b_ptr,
               int b_stride,uint8_t *m_ptr,int m_stride,int height)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  undefined1 auVar7 [16];
  short sVar21;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  undefined1 auVar22 [16];
  undefined1 auVar31 [16];
  short sVar40;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  if (height < 1) {
    uVar6 = 0;
  }
  else {
    iVar5 = 0;
    uVar6 = 0;
    do {
      auVar33._4_4_ = *(undefined4 *)(src_ptr + src_stride);
      auVar33._0_4_ = *(undefined4 *)src_ptr;
      auVar33._8_8_ = 0;
      uVar1 = *(undefined4 *)(a_ptr + a_stride);
      uVar2 = *(undefined4 *)a_ptr;
      auVar24._0_8_ = CONCAT44(uVar1,uVar2);
      uVar3 = *(undefined4 *)(b_ptr + b_stride);
      uVar4 = *(undefined4 *)b_ptr;
      auVar30._8_6_ = 0;
      auVar30._0_8_ = auVar24._0_8_;
      auVar30[0xe] = (char)((uint)uVar1 >> 0x18);
      auVar30[0xf] = (char)((uint)uVar3 >> 0x18);
      auVar29._14_2_ = auVar30._14_2_;
      auVar29._8_5_ = 0;
      auVar29._0_8_ = auVar24._0_8_;
      auVar29[0xd] = (char)((uint)uVar3 >> 0x10);
      auVar28._13_3_ = auVar29._13_3_;
      auVar28._8_4_ = 0;
      auVar28._0_8_ = auVar24._0_8_;
      auVar28[0xc] = (char)((uint)uVar1 >> 0x10);
      auVar27._12_4_ = auVar28._12_4_;
      auVar27._8_3_ = 0;
      auVar27._0_8_ = auVar24._0_8_;
      auVar27[0xb] = (char)((uint)uVar3 >> 8);
      auVar26._11_5_ = auVar27._11_5_;
      auVar26._8_2_ = 0;
      auVar26._0_8_ = auVar24._0_8_;
      auVar26[10] = (char)((uint)uVar1 >> 8);
      auVar25._10_6_ = auVar26._10_6_;
      auVar25[8] = 0;
      auVar25._0_8_ = auVar24._0_8_;
      auVar25[9] = (char)uVar3;
      auVar24._9_7_ = auVar25._9_7_;
      auVar24[8] = (char)uVar1;
      auVar23._8_8_ = auVar24._8_8_;
      auVar23[7] = (char)((uint)uVar4 >> 0x18);
      auVar23[6] = (char)((uint)uVar2 >> 0x18);
      auVar23[5] = (char)((uint)uVar4 >> 0x10);
      auVar23[4] = (char)((uint)uVar2 >> 0x10);
      auVar23._0_4_ = uVar2;
      auVar22._4_12_ = auVar23._4_12_;
      auVar22[3] = (char)((uint)uVar4 >> 8);
      auVar22[2] = (char)((uint)uVar2 >> 8);
      auVar22[0] = (undefined1)uVar2;
      auVar22[1] = (char)uVar4;
      uVar1 = *(undefined4 *)m_ptr;
      uVar2 = *(undefined4 *)(m_ptr + m_stride);
      auVar8._0_8_ = CONCAT44(uVar2,uVar1);
      auVar31[0] = (char)uVar1;
      cVar15 = (char)((uint)uVar1 >> 8);
      cVar16 = (char)((uint)uVar1 >> 0x10);
      cVar17 = (char)((uint)uVar1 >> 0x18);
      cVar18 = (char)((uint)uVar2 >> 8);
      cVar19 = (char)((uint)uVar2 >> 0x10);
      cVar20 = (char)((uint)uVar2 >> 0x18);
      auVar14._8_6_ = 0;
      auVar14._0_8_ = auVar8._0_8_;
      auVar14[0xe] = cVar20;
      auVar14[0xf] = '@' - cVar20;
      auVar13._14_2_ = auVar14._14_2_;
      auVar13._8_5_ = 0;
      auVar13._0_8_ = auVar8._0_8_;
      auVar13[0xd] = '@' - cVar19;
      auVar12._13_3_ = auVar13._13_3_;
      auVar12._8_4_ = 0;
      auVar12._0_8_ = auVar8._0_8_;
      auVar12[0xc] = cVar19;
      auVar11._12_4_ = auVar12._12_4_;
      auVar11._8_3_ = 0;
      auVar11._0_8_ = auVar8._0_8_;
      auVar11[0xb] = '@' - cVar18;
      auVar10._11_5_ = auVar11._11_5_;
      auVar10._8_2_ = 0;
      auVar10._0_8_ = auVar8._0_8_;
      auVar10[10] = cVar18;
      auVar9._10_6_ = auVar10._10_6_;
      auVar9[8] = 0;
      auVar9._0_8_ = auVar8._0_8_;
      auVar9[9] = '@' - (char)uVar2;
      auVar8._9_7_ = auVar9._9_7_;
      auVar8[8] = (char)uVar2;
      auVar7._8_8_ = auVar8._8_8_;
      auVar7[7] = '@' - cVar17;
      auVar7[6] = cVar17;
      auVar7[5] = '@' - cVar16;
      auVar7[4] = cVar16;
      auVar7._0_4_ = uVar1;
      auVar31._4_12_ = auVar7._4_12_;
      auVar31[3] = '@' - cVar15;
      auVar31[2] = cVar15;
      auVar31[1] = '@' - auVar31[0];
      auVar31 = pmaddubsw(auVar22,auVar31);
      sVar21 = pavgw(auVar31._0_2_ >> 5,0);
      sVar34 = pavgw(auVar31._2_2_ >> 5,0);
      sVar35 = pavgw(auVar31._4_2_ >> 5,0);
      sVar36 = pavgw(auVar31._6_2_ >> 5,0);
      sVar37 = pavgw(auVar31._8_2_ >> 5,0);
      sVar38 = pavgw(auVar31._10_2_ >> 5,0);
      sVar39 = pavgw(auVar31._12_2_ >> 5,0);
      sVar40 = pavgw(auVar31._14_2_ >> 5,0);
      auVar32[1] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
      auVar32[0] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
      auVar32[2] = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
      auVar32[3] = (0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36);
      auVar32[4] = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
      auVar32[5] = (0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38);
      auVar32[6] = (0 < sVar39) * (sVar39 < 0x100) * (char)sVar39 - (0xff < sVar39);
      auVar32[7] = (0 < sVar40) * (sVar40 < 0x100) * (char)sVar40 - (0xff < sVar40);
      auVar32._8_8_ = 0;
      auVar33 = psadbw(auVar32,auVar33);
      uVar6 = uVar6 + auVar33._0_4_;
      src_ptr = src_ptr + src_stride * 2;
      a_ptr = a_ptr + a_stride * 2;
      b_ptr = b_ptr + b_stride * 2;
      m_ptr = m_ptr + m_stride * 2;
      iVar5 = iVar5 + 2;
    } while (iVar5 < height);
  }
  return uVar6;
}

Assistant:

unsigned int aom_masked_sad4xh_ssse3(const uint8_t *src_ptr, int src_stride,
                                     const uint8_t *a_ptr, int a_stride,
                                     const uint8_t *b_ptr, int b_stride,
                                     const uint8_t *m_ptr, int m_stride,
                                     int height) {
  int y;
  __m128i res = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi8((1 << AOM_BLEND_A64_ROUND_BITS));

  for (y = 0; y < height; y += 2) {
    // Load two rows at a time, this seems to be a bit faster
    // than four rows at a time in this case.
    const __m128i src =
        _mm_unpacklo_epi32(_mm_cvtsi32_si128(*(int *)src_ptr),
                           _mm_cvtsi32_si128(*(int *)&src_ptr[src_stride]));
    const __m128i a =
        _mm_unpacklo_epi32(_mm_cvtsi32_si128(*(int *)a_ptr),
                           _mm_cvtsi32_si128(*(int *)&a_ptr[a_stride]));
    const __m128i b =
        _mm_unpacklo_epi32(_mm_cvtsi32_si128(*(int *)b_ptr),
                           _mm_cvtsi32_si128(*(int *)&b_ptr[b_stride]));
    const __m128i m =
        _mm_unpacklo_epi32(_mm_cvtsi32_si128(*(int *)m_ptr),
                           _mm_cvtsi32_si128(*(int *)&m_ptr[m_stride]));
    const __m128i m_inv = _mm_sub_epi8(mask_max, m);

    const __m128i data = _mm_unpacklo_epi8(a, b);
    const __m128i mask = _mm_unpacklo_epi8(m, m_inv);
    __m128i pred_16bit = _mm_maddubs_epi16(data, mask);
    pred_16bit = xx_roundn_epu16(pred_16bit, AOM_BLEND_A64_ROUND_BITS);

    const __m128i pred = _mm_packus_epi16(pred_16bit, _mm_setzero_si128());
    res = _mm_add_epi32(res, _mm_sad_epu8(pred, src));

    src_ptr += src_stride * 2;
    a_ptr += a_stride * 2;
    b_ptr += b_stride * 2;
    m_ptr += m_stride * 2;
  }
  // At this point, the SAD is stored in lane 0 of 'res'
  return (unsigned int)_mm_cvtsi128_si32(res);
}